

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_instance_cache.cpp
# Opt level: O2

shared_ptr<duckdb::DuckDB,_true> __thiscall
duckdb::DBInstanceCache::GetInstanceInternal
          (DBInstanceCache *this,string *database,DBConfig *config)

{
  bool bVar1;
  type fs;
  iterator __it;
  DuckDB *this_00;
  DatabaseInstance *pDVar2;
  ConnectionException *this_01;
  DBConfig *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<duckdb::DuckDB,_true> sVar4;
  allocator local_a9;
  shared_ptr<duckdb::DuckDB,_true> db_instance;
  shared_ptr<duckdb::DatabaseCacheEntry,_true> cache_entry;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> local_80;
  DBInstanceCache *local_78;
  string local_70;
  string abs_database_path;
  
  FileSystem::CreateLocal();
  fs = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator*
                 ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> *)
                  &local_80);
  GetDBAbsolutePath(&abs_database_path,(string *)config,fs);
  __it = ::std::
         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)database,&abs_database_path);
  if (__it.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (this->db_instances)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this->db_instances)._M_h._M_bucket_count = 0;
  }
  else {
    weak_ptr<duckdb::DatabaseCacheEntry,_true>::lock
              ((weak_ptr<duckdb::DatabaseCacheEntry,_true> *)&cache_entry);
    if (cache_entry.internal.
        super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)database,
              (const_iterator)
              __it.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_true>
              ._M_cur);
      (this->db_instances)._M_h._M_buckets = (__buckets_ptr)0x0;
      (this->db_instances)._M_h._M_bucket_count = 0;
    }
    else {
      shared_ptr<duckdb::DatabaseCacheEntry,_true>::operator->(&cache_entry);
      weak_ptr<duckdb::DuckDB,_true>::lock((weak_ptr<duckdb::DuckDB,_true> *)&db_instance);
      if (db_instance.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        local_78 = this;
        while (cache_entry.internal.
               super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)0x0) {
          ::std::__shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>::reset
                    ((__shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2> *)
                     &cache_entry);
          weak_ptr<duckdb::DatabaseCacheEntry,_true>::lock
                    ((weak_ptr<duckdb::DatabaseCacheEntry,_true> *)&local_70);
          shared_ptr<duckdb::DatabaseCacheEntry,_true>::operator=
                    (&cache_entry,(shared_ptr<duckdb::DatabaseCacheEntry,_true> *)&local_70);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
        }
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)database,
                (const_iterator)
                __it.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_true>
                ._M_cur);
        (local_78->db_instances)._M_h._M_buckets = (__buckets_ptr)0x0;
        (local_78->db_instances)._M_h._M_bucket_count = 0;
        this = local_78;
      }
      else {
        this_00 = shared_ptr<duckdb::DuckDB,_true>::operator->(&db_instance);
        pDVar2 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this_00->instance);
        bVar1 = DBConfig::operator!=(&pDVar2->config,in_RCX);
        _Var3 = db_instance.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
        if (bVar1) {
          this_01 = (ConnectionException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_70,
                     "Can\'t open a connection to same database file with a different configuration than existing connections"
                     ,&local_a9);
          ConnectionException::ConnectionException(this_01,&local_70);
          __cxa_throw(this_01,&ConnectionException::typeinfo,::std::runtime_error::~runtime_error);
        }
        db_instance.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->db_instances)._M_h._M_buckets =
             (__buckets_ptr)
             db_instance.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        (this->db_instances)._M_h._M_bucket_count = (size_type)_Var3._M_pi;
        db_instance.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&db_instance.internal.
                  super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cache_entry.internal.
                super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  ::std::__cxx11::string::~string((string *)&abs_database_path);
  _Var3._M_pi = extraout_RDX;
  if (local_80._M_head_impl != (FileSystem *)0x0) {
    (*(local_80._M_head_impl)->_vptr_FileSystem[1])();
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::DuckDB,_true>)
         sVar4.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<DuckDB> DBInstanceCache::GetInstanceInternal(const string &database, const DBConfig &config) {
	auto local_fs = FileSystem::CreateLocal();
	auto abs_database_path = GetDBAbsolutePath(database, *local_fs);
	auto entry = db_instances.find(abs_database_path);
	if (entry == db_instances.end()) {
		// path does not exist in the list yet - no cache entry
		return nullptr;
	}
	auto cache_entry = entry->second.lock();
	if (!cache_entry) {
		// cache entry does not exist anymore - clean it up
		db_instances.erase(entry);
		return nullptr;
	}
	// cache entry exists - check if the actual database still exists
	auto db_instance = cache_entry->database.lock();
	if (!db_instance) {
		// if the database does not exist, but the cache entry still exists, the database is being shut down
		// we need to wait until the database is fully shut down to safely proceed
		// we do this here using a busy spin
		while (cache_entry) {
			// clear our cache entry
			cache_entry.reset();
			// try to lock it again
			cache_entry = entry->second.lock();
		}
		// the cache entry has now been deleted - clear it from the set of database instances and return
		db_instances.erase(entry);
		return nullptr;
	}
	// the database instance exists - check that the config matches
	if (db_instance->instance->config != config) {
		throw duckdb::ConnectionException(
		    "Can't open a connection to same database file with a different configuration "
		    "than existing connections");
	}
	return db_instance;
}